

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O3

BasicBlock * __thiscall spvtools::opt::Loop::FindConditionBlock(Loop *this)

{
  IRContext *pIVar1;
  CFG *this_00;
  Instruction *pIVar2;
  pointer puVar3;
  Instruction *this_01;
  Loop *pLVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  const_iterator cVar8;
  BasicBlock *pBVar9;
  uint uVar10;
  pointer puVar11;
  bool bVar12;
  uint local_3c;
  Loop *local_38;
  
  pBVar9 = this->loop_merge_;
  if (pBVar9 != (BasicBlock *)0x0) {
    pIVar1 = this->context_;
    if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
      IRContext::BuildCFG(pIVar1);
      pBVar9 = this->loop_merge_;
    }
    this_00 = (pIVar1->cfg_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>.
              _M_t.
              super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
              .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
    pIVar2 = (pBVar9->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar5 = 0;
    if (pIVar2->has_result_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
    }
    pvVar7 = CFG::preds(this_00,uVar5);
    puVar11 = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar3 = (pvVar7->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar11 == puVar3) {
      return (BasicBlock *)0x0;
    }
    uVar5 = 0;
    local_38 = this;
    do {
      uVar10 = *puVar11;
      local_3c = uVar10;
      cVar8 = std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&(this->loop_basic_blocks_)._M_h,&local_3c);
      pLVar4 = local_38;
      if ((cVar8.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) &&
         (bVar12 = uVar5 != 0, uVar5 = uVar10, bVar12)) {
        return (BasicBlock *)0x0;
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar3);
    if (uVar5 != 0) {
      pIVar1 = local_38->context_;
      if ((pIVar1->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(pIVar1);
      }
      pBVar9 = CFG::block((pIVar1->cfg_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                          .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,uVar5);
      if (pBVar9 != (BasicBlock *)0x0) {
        pIVar2 = (pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
        if ((pIVar2 == (Instruction *)0x0) ||
           ((pIVar2->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
          __assert_fail("!insts_.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                        ,0x7e,"const_iterator spvtools::opt::BasicBlock::ctail() const");
        }
        pIVar2 = (pBVar9->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                 super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
        uVar5 = 0;
        if (pIVar2->opcode_ == OpBranchConditional) {
          uVar10 = (pIVar2->has_result_id_ & 1) + 1;
          if (pIVar2->has_type_id_ == false) {
            uVar10 = (uint)pIVar2->has_result_id_;
          }
          uVar6 = Instruction::GetSingleWordOperand(pIVar2,uVar10 + 1);
          this_01 = (pLVar4->loop_merge_->label_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          if (this_01->has_result_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
          }
          if (uVar6 == uVar5) {
            return pBVar9;
          }
          uVar10 = (pIVar2->has_result_id_ & 1) + 1;
          if (pIVar2->has_type_id_ == false) {
            uVar10 = (uint)pIVar2->has_result_id_;
          }
          uVar5 = Instruction::GetSingleWordOperand(pIVar2,uVar10 + 2);
          pIVar2 = (local_38->loop_merge_->label_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          uVar6 = 0;
          if (pIVar2->has_result_id_ == true) {
            uVar6 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
          }
          if (uVar5 == uVar6) {
            return pBVar9;
          }
        }
      }
    }
  }
  return (BasicBlock *)0x0;
}

Assistant:

BasicBlock* Loop::FindConditionBlock() const {
  if (!loop_merge_) {
    return nullptr;
  }
  BasicBlock* condition_block = nullptr;

  uint32_t in_loop_pred = 0;
  for (uint32_t p : context_->cfg()->preds(loop_merge_->id())) {
    if (IsInsideLoop(p)) {
      if (in_loop_pred) {
        // 2 in-loop predecessors.
        return nullptr;
      }
      in_loop_pred = p;
    }
  }
  if (!in_loop_pred) {
    // Merge block is unreachable.
    return nullptr;
  }

  BasicBlock* bb = context_->cfg()->block(in_loop_pred);

  if (!bb) return nullptr;

  const Instruction& branch = *bb->ctail();

  // Make sure the branch is a conditional branch.
  if (branch.opcode() != spv::Op::OpBranchConditional) return nullptr;

  // Make sure one of the two possible branches is to the merge block.
  if (branch.GetSingleWordInOperand(1) == loop_merge_->id() ||
      branch.GetSingleWordInOperand(2) == loop_merge_->id()) {
    condition_block = bb;
  }

  return condition_block;
}